

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O0

void soplex::updateScale<double>
               (SSVectorBase<double> *vecnnzeroes,SSVectorBase<double> *resnvec,
               SSVectorBase<double> *tmpvec,SSVectorBase<double> **psccurr,
               SSVectorBase<double> **pscprev,double qcurr,double qprev,double eprev1,double eprev2,
               double epsilon)

{
  _func_int **pp_Var1;
  bool bVar2;
  SSVectorBase<double> *vec;
  SSVectorBase<double> *in_RCX;
  SSVectorBase<double> *in_RDI;
  SSVectorBase<double> *in_R8;
  SSVectorBase<double> *in_XMM0_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  SSVectorBase<double> *in_XMM4_Qa;
  SSVectorBase<double> *pssv;
  double fac;
  double in_stack_ffffffffffffff88;
  
  vec = (SSVectorBase<double> *)-(in_XMM2_Qa * in_XMM3_Qa);
  SSVectorBase<double>::operator-=(in_RCX,in_R8);
  bVar2 = isZero<double,double>((double)in_RDI,in_stack_ffffffffffffff88);
  if (bVar2) {
    SSVectorBase<double>::clear(in_RDI);
  }
  else {
    SSVectorBase<double>::operator*=(in_XMM4_Qa,(double)vec);
  }
  SSVectorBase<double>::assignPWproduct4setup<double,double>(in_RCX,in_R8,in_XMM0_Qa);
  SSVectorBase<double>::operator+=(in_XMM4_Qa,vec);
  SSVectorBase<double>::operator*=(in_XMM4_Qa,(double)vec);
  SSVectorBase<double>::operator+=(in_XMM4_Qa,vec);
  pp_Var1 = (in_RCX->super_IdxSet)._vptr_IdxSet;
  (in_RCX->super_IdxSet)._vptr_IdxSet = (in_R8->super_IdxSet)._vptr_IdxSet;
  (in_R8->super_IdxSet)._vptr_IdxSet = pp_Var1;
  return;
}

Assistant:

static void updateScale(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R qcurr,
   R qprev,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);
   assert(qcurr * qprev != 0.0);

   R fac = -(eprev1 * eprev2);

   SSVectorBase<R>* pssv;

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);

   *pscprev *= 1.0 / (qcurr * qprev);
   *pscprev += *psccurr;

   /* swap pointers */
   pssv = psccurr;
   psccurr = pscprev;
   pscprev = pssv;
}